

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wlcBlast.c
# Opt level: O3

int Wlc_NtkMuxTree2(Gia_Man_t *pNew,int *pCtrl,int nCtrl,Vec_Int_t *vData,Vec_Int_t *vAnds,
                   Vec_Int_t *vTemp)

{
  uint uVar1;
  long lVar2;
  
  if (nCtrl != 0) {
    if (vData->nSize != 1 << ((byte)nCtrl & 0x1f)) {
      __assert_fail("!nCtrl || Vec_IntSize(vData) == (1 << nCtrl)",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/base/wlc/wlcBlast.c"
                    ,0x7f,
                    "int Wlc_NtkMuxTree2(Gia_Man_t *, int *, int, Vec_Int_t *, Vec_Int_t *, Vec_Int_t *)"
                   );
    }
    if (vAnds->nSize != vData->nSize) {
      __assert_fail("!nCtrl || Vec_IntSize(vAnds) == (1 << nCtrl)",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/base/wlc/wlcBlast.c"
                    ,0x80,
                    "int Wlc_NtkMuxTree2(Gia_Man_t *, int *, int, Vec_Int_t *, Vec_Int_t *, Vec_Int_t *)"
                   );
    }
  }
  vTemp->nSize = 0;
  if (0 < vAnds->nSize) {
    lVar2 = 0;
    do {
      if (vData->nSize <= lVar2) {
        __assert_fail("i >= 0 && i < p->nSize",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/misc/vec/vecInt.h"
                      ,0x1a9,"int Vec_IntEntry(Vec_Int_t *, int)");
      }
      uVar1 = Gia_ManHashAnd(pNew,vAnds->pArray[lVar2],vData->pArray[lVar2]);
      if ((int)uVar1 < 0) goto LAB_008ac5f2;
      Vec_IntPush(vTemp,uVar1 ^ 1);
      lVar2 = lVar2 + 1;
    } while (lVar2 < vAnds->nSize);
  }
  uVar1 = Gia_ManHashAndMulti(pNew,vTemp);
  if (-1 < (int)uVar1) {
    return uVar1 ^ 1;
  }
LAB_008ac5f2:
  __assert_fail("Lit >= 0",
                "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/misc/util/abc_global.h"
                ,0x131,"int Abc_LitNot(int)");
}

Assistant:

int Wlc_NtkMuxTree2( Gia_Man_t * pNew, int * pCtrl, int nCtrl, Vec_Int_t * vData, Vec_Int_t * vAnds, Vec_Int_t * vTemp )
{
    int m, iLit;
    assert( !nCtrl || Vec_IntSize(vData) == (1 << nCtrl) );
    assert( !nCtrl || Vec_IntSize(vAnds) == (1 << nCtrl) );
    Vec_IntClear( vTemp );
    Vec_IntForEachEntry( vAnds, iLit, m )
        Vec_IntPush( vTemp, Abc_LitNot( Gia_ManHashAnd(pNew, iLit, Vec_IntEntry(vData, m)) ) );
    return Abc_LitNot( Gia_ManHashAndMulti(pNew, vTemp) );
}